

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::makeImageType
          (Builder *this,Id sampledType,Dim dim,bool depth,bool arrayed,bool ms,uint sampled,
          ImageFormat format)

{
  int iVar1;
  Id IVar2;
  Dim DVar3;
  uint uVar4;
  ImageFormat IVar5;
  size_type sVar6;
  reference ppIVar7;
  Instruction *this_00;
  size_t size;
  undefined8 uVar8;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_50 [3];
  int local_34;
  Instruction *pIStack_30;
  int t;
  Instruction *type;
  Dim local_20;
  bool ms_local;
  bool arrayed_local;
  Id IStack_1c;
  bool depth_local;
  Dim dim_local;
  Id sampledType_local;
  Builder *this_local;
  
  size = (size_t)dim;
  type._5_1_ = ms;
  type._6_1_ = arrayed;
  type._7_1_ = depth;
  local_20 = dim;
  IStack_1c = sampledType;
  _dim_local = this;
  if (sampled != 1 && sampled != 2) {
    __assert_fail("sampled == 1 || sampled == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                  ,0x1de,
                  "Id spv::Builder::makeImageType(Id, Dim, bool, bool, bool, unsigned int, ImageFormat)"
                 );
  }
  local_34 = 0;
  do {
    iVar1 = local_34;
    sVar6 = std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
            size(this->groupedTypes + 0x19);
    if ((int)sVar6 <= iVar1) {
      this_00 = (Instruction *)Instruction::operator_new((Instruction *)0x38,size);
      IVar2 = getUniqueId(this);
      Instruction::Instruction(this_00,IVar2,0,OpTypeImage);
      pIStack_30 = this_00;
      Instruction::addIdOperand(this_00,IStack_1c);
      Instruction::addImmediateOperand(pIStack_30,local_20);
      Instruction::addImmediateOperand(pIStack_30,type._7_1_ & 1);
      Instruction::addImmediateOperand(pIStack_30,type._6_1_ & 1);
      Instruction::addImmediateOperand(pIStack_30,type._5_1_ & 1);
      Instruction::addImmediateOperand(pIStack_30,sampled);
      Instruction::addImmediateOperand(pIStack_30,format);
      std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
      push_back(this->groupedTypes + 0x19,&stack0xffffffffffffffd0);
      std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
      unique_ptr<std::default_delete<spv::Instruction>,void>
                ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_50,
                 pIStack_30);
      std::
      vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ::push_back(&this->constantsTypesGlobals,(value_type *)local_50);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (local_50);
      Module::mapInstruction(&this->module,pIStack_30);
      switch(local_20) {
      case Dim1D:
        if (sampled == 1) {
          addCapability(this,CapabilitySampled1D);
        }
        else {
          addCapability(this,CapabilityImage1D);
        }
        break;
      default:
        break;
      case DimCube:
        if ((type._6_1_ & 1) != 0) {
          if (sampled == 1) {
            addCapability(this,CapabilitySampledCubeArray);
          }
          else {
            addCapability(this,CapabilityImageCubeArray);
          }
        }
        break;
      case DimRect:
        if (sampled == 1) {
          addCapability(this,CapabilitySampledRect);
        }
        else {
          addCapability(this,CapabilityImageRect);
        }
        break;
      case DimBuffer:
        if (sampled == 1) {
          addCapability(this,CapabilitySampledBuffer);
        }
        else {
          addCapability(this,CapabilityImageBuffer);
        }
        break;
      case DimSubpassData:
        addCapability(this,CapabilityInputAttachment);
      }
      if (((type._5_1_ & 1) != 0) && (sampled == 2)) {
        if (local_20 != DimSubpassData) {
          addCapability(this,CapabilityStorageImageMultisample);
        }
        if ((type._6_1_ & 1) != 0) {
          addCapability(this,CapabilityImageMSArray);
        }
      }
      IVar2 = Instruction::getResultId(pIStack_30);
      return IVar2;
    }
    ppIVar7 = std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
              operator[](this->groupedTypes + 0x19,(long)local_34);
    pIStack_30 = *ppIVar7;
    size = 0;
    IVar2 = Instruction::getIdOperand(pIStack_30,0);
    if (IVar2 == IStack_1c) {
      size = 1;
      DVar3 = Instruction::getImmediateOperand(pIStack_30,1);
      if (DVar3 == local_20) {
        uVar8 = 0;
        uVar4 = Instruction::getImmediateOperand(pIStack_30,2);
        size = CONCAT71((int7)((ulong)uVar8 >> 8),type._7_1_);
        if (uVar4 == ((type._7_1_ & 1) != 0)) {
          uVar8 = 0;
          uVar4 = Instruction::getImmediateOperand(pIStack_30,3);
          size = CONCAT71((int7)((ulong)uVar8 >> 8),type._6_1_);
          if (uVar4 == ((type._6_1_ & 1) != 0)) {
            uVar8 = 0;
            uVar4 = Instruction::getImmediateOperand(pIStack_30,4);
            size = CONCAT71((int7)((ulong)uVar8 >> 8),type._5_1_);
            if (uVar4 == ((type._5_1_ & 1) != 0)) {
              size = 5;
              uVar4 = Instruction::getImmediateOperand(pIStack_30,5);
              if (uVar4 == sampled) {
                size = 6;
                IVar5 = Instruction::getImmediateOperand(pIStack_30,6);
                if (IVar5 == format) {
                  IVar2 = Instruction::getResultId(pIStack_30);
                  return IVar2;
                }
              }
            }
          }
        }
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

Id Builder::makeImageType(Id sampledType, Dim dim, bool depth, bool arrayed, bool ms, unsigned sampled, ImageFormat format)
{
    assert(sampled == 1 || sampled == 2);

    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeImage].size(); ++t) {
        type = groupedTypes[OpTypeImage][t];
        if (type->getIdOperand(0) == sampledType &&
            type->getImmediateOperand(1) == (unsigned int)dim &&
            type->getImmediateOperand(2) == (  depth ? 1u : 0u) &&
            type->getImmediateOperand(3) == (arrayed ? 1u : 0u) &&
            type->getImmediateOperand(4) == (     ms ? 1u : 0u) &&
            type->getImmediateOperand(5) == sampled &&
            type->getImmediateOperand(6) == (unsigned int)format)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeImage);
    type->addIdOperand(sampledType);
    type->addImmediateOperand(   dim);
    type->addImmediateOperand(  depth ? 1 : 0);
    type->addImmediateOperand(arrayed ? 1 : 0);
    type->addImmediateOperand(     ms ? 1 : 0);
    type->addImmediateOperand(sampled);
    type->addImmediateOperand((unsigned int)format);

    groupedTypes[OpTypeImage].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    // deal with capabilities
    switch (dim) {
    case DimBuffer:
        if (sampled == 1)
            addCapability(CapabilitySampledBuffer);
        else
            addCapability(CapabilityImageBuffer);
        break;
    case Dim1D:
        if (sampled == 1)
            addCapability(CapabilitySampled1D);
        else
            addCapability(CapabilityImage1D);
        break;
    case DimCube:
        if (arrayed) {
            if (sampled == 1)
                addCapability(CapabilitySampledCubeArray);
            else
                addCapability(CapabilityImageCubeArray);
        }
        break;
    case DimRect:
        if (sampled == 1)
            addCapability(CapabilitySampledRect);
        else
            addCapability(CapabilityImageRect);
        break;
    case DimSubpassData:
        addCapability(CapabilityInputAttachment);
        break;
    default:
        break;
    }

    if (ms) {
        if (sampled == 2) {
            // Images used with subpass data are not storage
            // images, so don't require the capability for them.
            if (dim != Dim::DimSubpassData)
                addCapability(CapabilityStorageImageMultisample);
            if (arrayed)
                addCapability(CapabilityImageMSArray);
        }
    }

    return type->getResultId();
}